

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

void __thiscall testing::internal::FilePath::Normalize(FilePath *this)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  char *__s;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  
  pcVar6 = (this->pathname_)._M_dataplus._M_p;
  pcVar3 = (char *)(this->pathname_)._M_string_length;
  if (pcVar6 != (char *)0x0) {
    __s = (char *)operator_new__((ulong)(pcVar3 + 1));
    memset(__s,0,(size_t)(pcVar3 + 1));
    cVar2 = *pcVar6;
    pcVar4 = __s;
    while (cVar2 != '\0') {
      *pcVar4 = cVar2;
      if (*pcVar6 == '/') {
        pcVar5 = pcVar6 + -1;
        do {
          pcVar6 = pcVar5 + 1;
          pcVar1 = pcVar5 + 1;
          pcVar5 = pcVar6;
        } while (*pcVar1 == '/');
      }
      else {
        pcVar6 = pcVar6 + 1;
      }
      pcVar4 = pcVar4 + 1;
      cVar2 = *pcVar6;
    }
    *pcVar4 = '\0';
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)this,0,pcVar3,(ulong)__s);
    operator_delete__(__s);
    return;
  }
  std::__cxx11::string::_M_replace((ulong)this,0,pcVar3,0x13fc21);
  return;
}

Assistant:

void FilePath::Normalize() {
  if (pathname_.c_str() == NULL) {
    pathname_ = "";
    return;
  }
  const char* src = pathname_.c_str();
  char* const dest = new char[pathname_.length() + 1];
  char* dest_ptr = dest;
  memset(dest_ptr, 0, pathname_.length() + 1);

  while (*src != '\0') {
    *dest_ptr = *src;
    if (!IsPathSeparator(*src)) {
      src++;
    } else {
#if GTEST_HAS_ALT_PATH_SEP_
      if (*dest_ptr == kAlternatePathSeparator) {
        *dest_ptr = kPathSeparator;
      }
#endif
      while (IsPathSeparator(*src))
        src++;
    }
    dest_ptr++;
  }
  *dest_ptr = '\0';
  pathname_ = dest;
  delete[] dest;
}